

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O1

Matrix<std::complex<float>_> * __thiscall
webrtc::Matrix<std::complex<float>_>::Transpose
          (Matrix<std::complex<float>_> *this,Matrix<std::complex<float>_> *operand)

{
  string *result;
  Matrix<std::complex<float>_> *pMVar1;
  int line;
  FatalMessage FStack_188;
  
  if (operand->num_rows_ == this->num_columns_) {
    result = (string *)0x0;
  }
  else {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&operand->num_rows_,&this->num_columns_,"operand.num_rows_ == num_columns_")
    ;
  }
  if (result == (string *)0x0) {
    if (operand->num_columns_ == this->num_rows_) {
      result = (string *)0x0;
    }
    else {
      result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                         (&operand->num_columns_,&this->num_rows_,
                          "operand.num_columns_ == num_rows_");
    }
    if (result == (string *)0x0) {
      pMVar1 = Transpose(this,(operand->elements_).
                              super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      return pMVar1;
    }
    line = 0x8d;
  }
  else {
    line = 0x8c;
  }
  rtc::FatalMessage::FatalMessage
            (&FStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/matrix.h"
             ,line,result);
  rtc::FatalMessage::~FatalMessage(&FStack_188);
}

Assistant:

Matrix& Transpose(const Matrix& operand) {
    RTC_CHECK_EQ(operand.num_rows_, num_columns_);
    RTC_CHECK_EQ(operand.num_columns_, num_rows_);

    return Transpose(operand.elements());
  }